

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int vec_eq(void *v,void *vv)

{
  uint local_34;
  uint i;
  AbstractVec *avv;
  AbstractVec *av;
  void *vv_local;
  void *v_local;
  
  if (*v == *vv) {
    for (local_34 = 0; local_34 < *v; local_34 = local_34 + 1) {
      if (*(long *)(*(long *)((long)v + 8) + (ulong)local_34 * 8) !=
          *(long *)(*(long *)((long)vv + 8) + (ulong)local_34 * 8)) {
        return 0;
      }
    }
    v_local._4_4_ = 1;
  }
  else {
    v_local._4_4_ = 0;
  }
  return v_local._4_4_;
}

Assistant:

int vec_eq(void *v, void *vv) {
  AbstractVec *av = (AbstractVec *)v;
  AbstractVec *avv = (AbstractVec *)vv;
  uint i;

  if (av->n != avv->n) return 0;
  for (i = 0; i < av->n; i++)
    if (av->v[i] != avv->v[i]) return 0;
  return 1;
}